

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.cpp
# Opt level: O0

Tag * __thiscall
Mustache::Renderer::findTag
          (Tag *__return_storage_ptr__,Renderer *this,QString *content,int pos,int endPos)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  qsizetype qVar4;
  long lVar5;
  QString local_f8;
  QChar local_da;
  int local_d8;
  QChar local_d4;
  QChar local_d2;
  int endTache;
  QChar local_cc;
  QChar local_ca;
  QString local_c8;
  QChar local_b0;
  QChar local_ae;
  QChar local_ac;
  QChar local_aa;
  QString local_a8;
  QChar local_8c;
  QChar local_8a;
  QString local_88;
  QChar local_6c;
  QChar local_6a;
  QString local_68;
  QChar local_4a;
  QChar local_48;
  char16_t local_46;
  QChar typeChar;
  int tagEndPos;
  int tagStartPos;
  int endPos_local;
  int pos_local;
  QString *content_local;
  Renderer *this_local;
  Tag *tag;
  
  iVar2 = QString::indexOf((QString *)content,(longlong)&this->m_tagStartMarker,pos);
  if ((iVar2 == -1) || (endPos <= iVar2)) {
    Tag::Tag(__return_storage_ptr__);
  }
  else {
    qVar4 = QString::length(&this->m_tagStartMarker);
    iVar3 = QString::indexOf((QString *)content,(longlong)&this->m_tagEndMarker,iVar2 + (int)qVar4);
    if (iVar3 == -1) {
      Tag::Tag(__return_storage_ptr__);
    }
    else {
      qVar4 = QString::length(&this->m_tagEndMarker);
      iVar3 = iVar3 + (int)qVar4;
      Tag::Tag(__return_storage_ptr__);
      __return_storage_ptr__->type = Value;
      __return_storage_ptr__->start = iVar2;
      __return_storage_ptr__->end = iVar3;
      qVar4 = QString::length(&this->m_tagStartMarker);
      tagStartPos = iVar2 + (int)qVar4;
      qVar4 = QString::length(&this->m_tagEndMarker);
      tagEndPos = iVar3 - (int)qVar4;
      local_48 = QString::at(content,(long)tagStartPos);
      local_46 = local_48.ucs;
      QChar::QChar(&local_4a,'#');
      bVar1 = operator==(local_48,local_4a);
      if (bVar1) {
        __return_storage_ptr__->type = SectionStart;
        readTagName(&local_68,content,tagStartPos + 1,tagEndPos);
        QString::operator=(&__return_storage_ptr__->key,&local_68);
        QString::~QString(&local_68);
      }
      else {
        local_6a.ucs = local_46;
        QChar::QChar(&local_6c,'^');
        bVar1 = operator==(local_6a,local_6c);
        if (bVar1) {
          __return_storage_ptr__->type = InvertedSectionStart;
          readTagName(&local_88,content,tagStartPos + 1,tagEndPos);
          QString::operator=(&__return_storage_ptr__->key,&local_88);
          QString::~QString(&local_88);
        }
        else {
          local_8a.ucs = local_46;
          QChar::QChar(&local_8c,'/');
          bVar1 = operator==(local_8a,local_8c);
          if (bVar1) {
            __return_storage_ptr__->type = SectionEnd;
            readTagName(&local_a8,content,tagStartPos + 1,tagEndPos);
            QString::operator=(&__return_storage_ptr__->key,&local_a8);
            QString::~QString(&local_a8);
          }
          else {
            local_aa.ucs = local_46;
            QChar::QChar(&local_ac,'!');
            bVar1 = operator==(local_aa,local_ac);
            if (bVar1) {
              __return_storage_ptr__->type = Comment;
            }
            else {
              local_ae.ucs = local_46;
              QChar::QChar(&local_b0,'>');
              bVar1 = operator==(local_ae,local_b0);
              if (bVar1) {
                __return_storage_ptr__->type = Partial;
                readTagName(&local_c8,content,tagStartPos + 1,tagEndPos);
                QString::operator=(&__return_storage_ptr__->key,&local_c8);
                QString::~QString(&local_c8);
              }
              else {
                local_ca.ucs = local_46;
                QChar::QChar(&local_cc,'=');
                bVar1 = operator==(local_ca,local_cc);
                if (bVar1) {
                  __return_storage_ptr__->type = SetDelimiter;
                  qVar4 = QString::length(&this->m_tagEndMarker);
                  readSetDelimiter(this,content,tagStartPos + 1,iVar3 - (int)qVar4);
                }
                else {
                  endTache._2_2_ = local_46;
                  QChar::QChar((QChar *)&endTache,'&');
                  bVar1 = operator==(endTache._2_2_,endTache._0_2_);
                  if (bVar1) {
                    __return_storage_ptr__->escapeMode = Unescape;
                    tagStartPos = tagStartPos + 1;
                  }
                  else {
                    local_d2.ucs = local_46;
                    QChar::QChar(&local_d4,'{');
                    bVar1 = operator==(local_d2,local_d4);
                    if (bVar1) {
                      __return_storage_ptr__->escapeMode = Raw;
                      tagStartPos = tagStartPos + CaseSensitive;
                      QChar::QChar(&local_da,'}');
                      local_d8 = QString::indexOf((QChar)(char16_t)content,
                                                  (ulong)(ushort)local_da.ucs,tagStartPos);
                      lVar5 = (long)local_d8;
                      iVar2 = __return_storage_ptr__->end;
                      qVar4 = QString::length(&this->m_tagEndMarker);
                      if (lVar5 == iVar2 - qVar4) {
                        __return_storage_ptr__->end = __return_storage_ptr__->end + 1;
                      }
                      else {
                        tagEndPos = local_d8;
                      }
                    }
                  }
                  __return_storage_ptr__->type = Value;
                  readTagName(&local_f8,content,tagStartPos,tagEndPos);
                  QString::operator=(&__return_storage_ptr__->key,&local_f8);
                  QString::~QString(&local_f8);
                }
              }
            }
          }
        }
      }
      if (__return_storage_ptr__->type != Value) {
        expandTag(__return_storage_ptr__,content);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Tag Renderer::findTag(const QString& content, int pos, int endPos)
{
	int tagStartPos = content.indexOf(m_tagStartMarker, pos);
	if (tagStartPos == -1 || tagStartPos >= endPos) {
		return Tag();
	}

	int tagEndPos = content.indexOf(m_tagEndMarker, tagStartPos + m_tagStartMarker.length());
	if (tagEndPos == -1) {
		return Tag();
	}
	tagEndPos += m_tagEndMarker.length();

	Tag tag;
	tag.type = Tag::Value;
	tag.start = tagStartPos;
	tag.end = tagEndPos;

	pos = tagStartPos + m_tagStartMarker.length();
	endPos = tagEndPos - m_tagEndMarker.length();

	QChar typeChar = content.at(pos);

	if (typeChar == '#') {
		tag.type = Tag::SectionStart;
		tag.key = readTagName(content, pos+1, endPos);
	} else if (typeChar == '^') {
		tag.type = Tag::InvertedSectionStart;
		tag.key = readTagName(content, pos+1, endPos);
	} else if (typeChar == '/') {
		tag.type = Tag::SectionEnd;
		tag.key = readTagName(content, pos+1, endPos);
	} else if (typeChar == '!') {
		tag.type = Tag::Comment;
	} else if (typeChar == '>') {
		tag.type = Tag::Partial;
		tag.key = readTagName(content, pos+1, endPos);
	} else if (typeChar == '=') {
		tag.type = Tag::SetDelimiter;
		readSetDelimiter(content, pos+1, tagEndPos - m_tagEndMarker.length());
	} else {
		if (typeChar == '&') {
			tag.escapeMode = Tag::Unescape;
			++pos;
		} else if (typeChar == '{') {
			tag.escapeMode = Tag::Raw;
			++pos;
			int endTache = content.indexOf('}', pos);
			if (endTache == tag.end - m_tagEndMarker.length()) {
				++tag.end;
			} else {
				endPos = endTache;
			}
		}
		tag.type = Tag::Value;
		tag.key = readTagName(content, pos, endPos);
	}

	if (tag.type != Tag::Value) {
		expandTag(tag, content);
	}

	return tag;
}